

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O3

double __thiscall nnad::Matrix<double>::GetElement(Matrix<double> *this,int *i,int *j)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  char *local_30;
  long local_28;
  char local_20 [16];
  
  iVar1 = *i;
  if ((iVar1 < 0) || (this->_Lines < iVar1)) {
    local_30 = local_20;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,"GetElement: line index out of range.","");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\x1b[1;31mERROR: ",0xe);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_30,local_28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[0m",4);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    iVar2 = *j;
    if ((-1 < iVar2) && (iVar2 <= this->_Columns)) {
      return (this->_Matrix).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[this->_Columns * iVar1 + iVar2];
    }
    local_30 = local_20;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,"GetElement: column index out of range.","");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\x1b[1;31mERROR: ",0xe);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_30,local_28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[0m",4);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  exit(-10);
}

Assistant:

T GetElement(int const& i, int const& j) const
    {
      if (i < 0 || i > _Lines)
        Error("GetElement: line index out of range.");

      if (j < 0 || j > _Columns)
        Error("GetElement: column index out of range.");

      return _Matrix[i * _Columns + j];
    }